

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O2

void __thiscall TcpConnection::~TcpConnection(TcpConnection *this)

{
  Logger *pLVar1;
  
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","~TcpConnection",0x22);
  }
  if (1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp"
                      ,"~TcpConnection",0x22,LOG_LEVEL_INFO,
                      "TcpConnection descontructed, fd is %d\n",this->tc_fd);
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  std::_Function_base::~_Function_base(&(this->tc_close_cb).super__Function_base);
  std::_Function_base::~_Function_base(&(this->tc_message_cb).super__Function_base);
  std::_Function_base::~_Function_base(&(this->tc_connected_cb).super__Function_base);
  std::any::reset(&this->tc_context);
  BufferBase::~BufferBase(&(this->tc_ibuf).super_BufferBase);
  BufferBase::~BufferBase(&(this->tc_obuf).super_BufferBase);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<TcpConnection>)._M_weak_this.
              super___weak_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TcpConnection::~TcpConnection() {
    LOG_INFO("TcpConnection descontructed, fd is %d\n", tc_fd);
}